

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void ReadVocab(void)

{
  int *piVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  char *__s;
  char c;
  char word [100];
  
  puts("Reading vocabulary...");
  pFVar3 = fopen(read_vocab_file,"rb");
  piVar1 = vocab_hash;
  if (pFVar3 == (FILE *)0x0) {
    __s = "Vocabulary file not found";
LAB_00102f3b:
    puts(__s);
    exit(1);
  }
  for (lVar4 = 0; lVar4 != 30000000; lVar4 = lVar4 + 1) {
    piVar1[lVar4] = -1;
  }
  vocab_size = 0;
  while( true ) {
    ReadWord(word,(FILE *)pFVar3);
    iVar2 = feof(pFVar3);
    if (iVar2 != 0) break;
    iVar2 = AddWordToVocab(word);
    __isoc99_fscanf(pFVar3,"%lld%c",vocab + iVar2,&c);
  }
  SortVocab();
  if (0 < debug_mode) {
    printf("Vocab size: %lld\n",vocab_size);
    printf("Words in train file: %lld\n",train_words);
  }
  if (1 < num_threads) {
    pFVar3 = fopen(train_file,"rb");
    if (pFVar3 == (FILE *)0x0) {
      __s = "ERROR: training data file not found!";
      goto LAB_00102f3b;
    }
    fseek(pFVar3,0,2);
    file_size = ftell(pFVar3);
    fclose(pFVar3);
  }
  return;
}

Assistant:

void ReadVocab() {
  printf("Reading vocabulary...\n");
  long long a, i = 0;
  char c;
  char word[MAX_STRING];
  FILE *fin = fopen(read_vocab_file, "rb");
  if (fin == NULL) {
    printf("Vocabulary file not found\n");
    exit(1);
  }
  for (a = 0; a < vocab_hash_size; a++) vocab_hash[a] = -1;
  vocab_size = 0;
  while (1) {
    ReadWord(word, fin);
    if (feof(fin)) break;
    a = AddWordToVocab(word);
    fscanf(fin, "%lld%c", &vocab[a].cn, &c);
    i++;
  }
  SortVocab();
  if (debug_mode > 0) {
    printf("Vocab size: %lld\n", vocab_size);
    printf("Words in train file: %lld\n", train_words);
  }

  // Don't do this if piping...
  if (num_threads > 1) {
    fin = fopen(train_file, "rb");
    if (fin == NULL) {
      printf("ERROR: training data file not found!\n");
      exit(1);
    }
    fseek(fin, 0, SEEK_END);
    file_size = ftell(fin);
    fclose(fin);
  }
}